

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

string * bech32::stripUnknownChars(string *__return_storage_ptr__,string *bstring)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined8 local_60 [4];
  undefined8 local_40;
  undefined8 local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_19;
  string *local_18;
  string *bstring_local;
  string *ret;
  
  local_19 = 0;
  local_18 = bstring;
  bstring_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)bstring);
  local_38 = std::__cxx11::string::begin();
  local_40 = std::__cxx11::string::end();
  local_30 = std::
             remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,bech32::stripUnknownChars(std::__cxx11::string_const&)::__0>
                       (local_38,local_40);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_28,&local_30);
  local_68._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_60,&local_68);
  std::__cxx11::string::erase(__return_storage_ptr__,local_28,local_60[0]);
  return __return_storage_ptr__;
}

Assistant:

std::string stripUnknownChars(const std::string &bstring) {
        std::string ret(bstring);
        ret.erase(
                std::remove_if(
                        ret.begin(), ret.end(),
                        [](char x){return (!isAllowedChar(static_cast<char>(::tolower(x))) && x!=separator);}),
                ret.end());
        return ret;
    }